

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O1

void anon_unknown.dwarf_538ca::testMatrix(M44f *M)

{
  ostream *poVar1;
  long lVar2;
  float (*pafVar3) [4];
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  V3f t;
  V3f r;
  V3f h;
  V3f s;
  M44f D;
  Vec3<float> local_e8;
  Vec3<float> local_dc;
  Vec3<float> local_d0;
  Vec3<float> local_c4;
  Matrix44<float> local_b8;
  Matrix44<float> local_70;
  
  Imath_2_5::extractSHRT<float>(M,&local_c4,&local_d0,&local_dc,&local_e8,true,Default);
  local_b8.x[0][2] = 0.0;
  local_b8.x[0][3] = 0.0;
  local_b8.x[1][2] = 0.0;
  local_b8.x[1][3] = 0.0;
  local_b8.x[2][0] = 0.0;
  local_b8.x[2][1] = 0.0;
  local_b8.x[0][0] = 1.0;
  local_b8.x[0][1] = 0.0;
  local_b8.x[1][0] = 0.0;
  local_b8.x[1][1] = 1.0;
  local_b8.x[2][2] = 1.0;
  local_b8.x[2][3] = 0.0;
  local_b8.x[3][0] = local_e8.z * 0.0 + local_e8.y * 0.0 + local_e8.x + 0.0;
  local_b8.x[3][1] = local_e8.z * 0.0 + local_e8.x * 0.0 + local_e8.y + 0.0;
  local_b8.x[3][2] = local_e8.x * 0.0 + local_e8.y * 0.0 + local_e8.z + 0.0;
  local_b8.x[3][3] = local_e8.z * 0.0 + local_e8.x * 0.0 + local_e8.y * 0.0 + 1.0;
  Imath_2_5::Matrix44<float>::rotate<float>(&local_b8,&local_dc);
  fVar11 = local_d0.z * local_b8.x[1][0];
  fVar12 = local_d0.z * local_b8.x[1][1];
  fVar13 = local_d0.z * local_b8.x[1][2];
  local_d0.z = local_d0.z * local_b8.x[1][3];
  fVar5 = local_d0.y * local_b8.x[0][0];
  fVar6 = local_d0.y * local_b8.x[0][1];
  fVar7 = local_d0.y * local_b8.x[0][2];
  local_d0.y = local_d0.y * local_b8.x[0][3];
  fVar8 = local_d0.x * local_b8.x[0][0];
  fVar9 = local_d0.x * local_b8.x[0][1];
  fVar10 = local_d0.x * local_b8.x[0][2];
  local_d0.x = local_d0.x * local_b8.x[0][3];
  local_b8.x[0][1] = local_c4.x * local_b8.x[0][1];
  local_b8.x[0][0] = local_c4.x * local_b8.x[0][0];
  local_b8.x[0][3] = local_c4.x * local_b8.x[0][3];
  local_b8.x[0][2] = local_c4.x * local_b8.x[0][2];
  local_b8.x[1][1] = local_c4.y * (fVar9 + local_b8.x[1][1]);
  local_b8.x[1][0] = local_c4.y * (fVar8 + local_b8.x[1][0]);
  local_b8.x[1][3] = local_c4.y * (local_d0.x + local_b8.x[1][3]);
  local_b8.x[1][2] = local_c4.y * (fVar10 + local_b8.x[1][2]);
  local_b8.x[2][1] = local_c4.z * (fVar6 + fVar12 + local_b8.x[2][1]);
  local_b8.x[2][0] = local_c4.z * (fVar5 + fVar11 + local_b8.x[2][0]);
  local_b8.x[2][3] = local_c4.z * (local_d0.y + local_d0.z + local_b8.x[2][3]);
  local_b8.x[2][2] = local_c4.z * (fVar7 + fVar13 + local_b8.x[2][2]);
  pafVar3 = (float (*) [4])&local_70;
  Imath_2_5::Matrix44<float>::operator-(M,&local_b8);
  lVar4 = 0;
  do {
    lVar2 = 0;
    do {
      if (1e-05 < ABS((*(float (*) [4])*pafVar3)[lVar2])) {
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*pafVar3)[lVar2]);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar2);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar1 = Imath_2_5::operator<<(poVar1,M);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar1 = Imath_2_5::operator<<(poVar1,&local_b8);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar1 = Imath_2_5::operator<<(poVar1,&local_70);
        std::endl<char,std::char_traits<char>>(poVar1);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                      ,0x118,"void (anonymous namespace)::testMatrix(const M44f)");
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    lVar4 = lVar4 + 1;
    pafVar3 = pafVar3 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void
testMatrix (const M44f M)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    V3f s, h, r, t;
  
    extractSHRT (M, s, h, r, t, true);

    M44f N;

    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.shear (h);
    N.scale (s);

    debug (("Re-scale: %f %f %f\n", s[0], s[1], s[2]));
    debug (("Re-shear: %f %f %f\n", h[0], h[1], h[2]));
    debug (("Re-rot  : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Re-trans: %f %f %f\n", t[0], t[1], t[2]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
	for (int k = 0; k < 4; ++k)
	{
	    if (abs (D[j][k]) > 0.00001)
	    {
		cout << "unexpectedly large matrix to "
			"euler angles conversion error: " <<
			D[j][k] << endl;

		cout << j << " " << k << endl;

		cout << "M\n" << M << endl;
		cout << "N\n" << N << endl;
		cout << "D\n" << D << endl;

		assert (false);
	    }
	}
    }
}